

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O3

string_view cmWindowsRegistry::FromView(View view)

{
  int iVar1;
  iterator iVar2;
  size_t sVar3;
  char *pcVar4;
  string_view sVar5;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  key_type local_b4 [3];
  undefined8 local_a8;
  char *local_a0;
  undefined4 local_98;
  undefined8 local_90;
  char *local_88;
  undefined4 local_80;
  undefined8 local_78;
  char *local_70;
  undefined4 local_68;
  undefined8 local_60;
  char *local_58;
  undefined4 local_50;
  undefined8 local_48;
  char *local_40;
  undefined4 local_38;
  undefined8 local_30;
  char *local_28;
  undefined4 local_20;
  undefined8 local_18;
  char *local_10;
  
  if (FromView(cmWindowsRegistry::View)::ViewDefinitions == '\0') {
    iVar1 = __cxa_guard_acquire(&FromView(cmWindowsRegistry::View)::ViewDefinitions);
    if (iVar1 != 0) {
      local_b4[1] = 0;
      local_a8 = 4;
      local_a0 = "BOTH";
      local_98 = 2;
      local_90 = 4;
      local_88 = "HOST";
      local_80 = 1;
      local_78 = 6;
      local_70 = "TARGET";
      local_68 = 5;
      local_60 = 2;
      local_58 = "32";
      local_50 = 6;
      local_48 = 2;
      local_40 = "64";
      local_38 = 4;
      local_30 = 5;
      local_28 = "32_64";
      local_20 = 3;
      local_18 = 5;
      local_10 = "64_32";
      std::
      _Hashtable<cmWindowsRegistry::View,std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<cmWindowsRegistry::View>,std::hash<cmWindowsRegistry::View>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _Hashtable<std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>const*>
                ((_Hashtable<cmWindowsRegistry::View,std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<cmWindowsRegistry::View>,std::hash<cmWindowsRegistry::View>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&FromView::ViewDefinitions,local_b4 + 1,&stack0xfffffffffffffff8,0,&local_b5,
                 &local_b6,&local_b7);
      __cxa_atexit(std::
                   unordered_map<cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<cmWindowsRegistry::View>,_std::equal_to<cmWindowsRegistry::View>,_std::allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::~unordered_map,&FromView::ViewDefinitions,&__dso_handle);
      __cxa_guard_release(&FromView(cmWindowsRegistry::View)::ViewDefinitions);
    }
  }
  iVar2 = std::
          _Hashtable<cmWindowsRegistry::View,_std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmWindowsRegistry::View>,_std::hash<cmWindowsRegistry::View>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&FromView::ViewDefinitions._M_h,local_b4);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pcVar4 = "";
    sVar3 = 0;
  }
  else {
    sVar3 = *(size_t *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                    ._M_cur + 0x10);
    pcVar4 = *(char **)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                              ._M_cur + 0x18);
  }
  sVar5._M_str = pcVar4;
  sVar5._M_len = sVar3;
  return sVar5;
}

Assistant:

cm::string_view cmWindowsRegistry::FromView(View view)
{
  static std::unordered_map<cmWindowsRegistry::View, cm::string_view>
    ViewDefinitions{
      { View::Both, "BOTH"_s },     { View::Host, "HOST"_s },
      { View::Target, "TARGET"_s }, { View::Reg32, "32"_s },
      { View::Reg64, "64"_s },      { View::Reg32_64, "32_64"_s },
      { View::Reg64_32, "64_32"_s }
    };

  auto it = ViewDefinitions.find(view);

  return it == ViewDefinitions.end() ? ""_s : it->second;
}